

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChessEngine.cpp
# Opt level: O0

ChessEngine * __thiscall
senjo::ChessEngine::Go
          (ChessEngine *this,int depth,int movestogo,uint64_t movetime,uint64_t wtime,uint64_t winc,
          uint64_t btime,uint64_t binc,string *ponder)

{
  bool bVar1;
  ulong uVar2;
  undefined4 in_register_00000034;
  long *param;
  undefined8 in_stack_00000020;
  int local_a4;
  uint64_t local_a0;
  ulong local_98;
  Output local_68;
  ulong local_60;
  uint64_t endTime;
  uint64_t timePerMove;
  uint64_t uStack_48;
  int moves;
  uint64_t timeRemaining;
  uint64_t wtime_local;
  uint64_t movetime_local;
  int movestogo_local;
  int depth_local;
  ChessEngine *this_local;
  string *bestmove;
  
  param = (long *)CONCAT44(in_register_00000034,depth);
  movetime_local._0_4_ = (int)movetime;
  _stop = _stop & 0xfffffffd;
  _searching = 1;
  timeRemaining = winc;
  wtime_local = wtime;
  movetime_local._4_4_ = movestogo;
  _movestogo_local = param;
  this_local = this;
  _startTime = Now();
  if (wtime_local == 0) {
    local_98 = 0;
  }
  else {
    local_98 = _startTime + wtime_local;
  }
  _stopTime = local_98;
  uVar2 = (**(code **)(*param + 0x68))();
  if ((uVar2 & 1) == 0) {
    local_a0 = binc;
  }
  else {
    local_a0 = timeRemaining;
  }
  uStack_48 = local_a0;
  if (local_a0 != 0) {
    if ((int)movetime_local == 0) {
      local_a4 = (**(code **)(*param + 0x88))();
    }
    else {
      local_a4 = (int)movetime_local;
    }
    timePerMove._4_4_ = local_a4;
    endTime = uStack_48 / (ulong)(long)local_a4;
    local_60 = _startTime + endTime;
    if ((_stopTime == 0) || (local_60 < _stopTime)) {
      _stopTime = local_60;
    }
  }
  uVar2 = (**(code **)(*param + 0x90))();
  if ((((uVar2 & 1) != 0) && (bVar1 = Thread::Active((Thread *)(param + 1)), !bVar1)) &&
     (bVar1 = Thread::Start((Thread *)(param + 1),Timer,param), !bVar1)) {
    Output::Output(&local_68,InfoPrefix);
    Output::operator<<(&local_68,(char (*) [30])"Failed to start timer thread!");
    Output::~Output(&local_68);
  }
  (**(code **)(*param + 0x138))
            (this,param,movetime_local._4_4_,(int)movetime_local,wtime_local,timeRemaining,btime,
             binc,ponder,in_stack_00000020);
  _searching = 0;
  return this;
}

Assistant:

std::string ChessEngine::Go(const int depth,
                            const int movestogo,
                            const uint64_t movetime,
                            const uint64_t wtime, const uint64_t winc,
                            const uint64_t btime, const uint64_t binc,
                            std::string* ponder)
{
  _stop &= ~StopReason::Timeout;
  _searching = true;
  _startTime = Now();

  // set _stopTime to something smarter in MyGo() if you wish
  _stopTime = (movetime ? (_startTime + movetime) : 0);
  const uint64_t timeRemaining = (WhiteToMove() ? wtime : btime);
  if (timeRemaining) {
    const int moves = (movestogo ? movestogo : MovesToGo());
    const uint64_t timePerMove = (timeRemaining / moves);
    const uint64_t endTime = (_startTime + timePerMove);
    if (!_stopTime || (endTime < _stopTime)) {
      _stopTime = endTime;
    }
  }

  if (UseTimer() && !timerThread.Active()) {
    if (!timerThread.Start(Timer, this)) {
      Output() << "Failed to start timer thread!";
    }
  }

  std::string bestmove =
      MyGo(depth, movestogo, movetime, wtime, winc, btime, binc, ponder);

  _searching = false;
  return bestmove;
}